

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance_test.cc
# Opt level: O2

Test * EditDistanceTestTestAllowReplacements::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001e3488;
  return g_current_test;
}

Assistant:

TEST(EditDistanceTest, TestAllowReplacements) {
  bool allow_replacements = true;
  EXPECT_EQ(1, EditDistance("ninja", "njnja", allow_replacements));
  EXPECT_EQ(1, EditDistance("njnja", "ninja", allow_replacements));

  allow_replacements = false;
  EXPECT_EQ(2, EditDistance("ninja", "njnja", allow_replacements));
  EXPECT_EQ(2, EditDistance("njnja", "ninja", allow_replacements));
}